

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  long lVar1;
  Expr *pExpr;
  long lVar2;
  long lVar3;
  
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = (long)pList->nExpr;
    }
    lVar3 = 0x20;
    for (lVar2 = 0; lVar2 < pAppend->nExpr; lVar2 = lVar2 + 1) {
      pExpr = sqlite3ExprDup(pParse->db,*(Expr **)((long)(pAppend->a + -1) + lVar3),0);
      if (((bIntToNull != 0) && (pExpr != (Expr *)0x0)) && (pExpr->op == 0x93)) {
        pExpr->op = 'r';
        pExpr->flags = pExpr->flags & 0xcffffbff;
      }
      pList = sqlite3ExprListAppend(pParse,pList,pExpr);
      if (pList != (ExprList *)0x0) {
        *(undefined1 *)((long)pList->a + lVar3 + lVar1 * 0x20 + -8) =
             *(undefined1 *)((long)pAppend->a + lVar3 + -8);
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      Expr *pDup = sqlite3ExprDup(pParse->db, pAppend->a[i].pExpr, 0);
      if( bIntToNull && pDup && pDup->op==TK_INTEGER ){
        pDup->op = TK_NULL;
        pDup->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].sortOrder = pAppend->a[i].sortOrder;
    }
  }
  return pList;
}